

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIFont::draw
          (CGUIFont *this,stringw *text,rect<int> *position,SColor color,bool hcenter,bool vcenter,
          rect<int> *clip)

{
  pointer pwVar1;
  pointer pSVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  wchar_t c;
  bool bVar7;
  vector2d<int> offset;
  undefined8 local_98;
  SColor color_local;
  array<unsigned_int> indices;
  array<irr::core::vector2d<int>_> offsets;
  
  if ((this->Driver != (IVideoDriver *)0x0) && (this->SpriteBank != (IGUISpriteBank *)0x0)) {
    offset = position->UpperLeftCorner;
    local_98 = 0;
    iVar4 = 0;
    color_local.color = color.color;
    if ((vcenter || hcenter) || clip != (rect<int> *)0x0) {
      local_98 = (**(code **)(*(long *)this + 8))(this,(text->str)._M_dataplus._M_p);
      iVar4 = (int)((ulong)local_98 >> 0x20);
    }
    if (hcenter) {
      offset.X = offset.X +
                 ((position->LowerRightCorner).X - ((position->UpperLeftCorner).X + (int)local_98)
                 >> 1);
    }
    if (vcenter) {
      offset.Y = offset.Y +
                 ((position->LowerRightCorner).Y - ((position->UpperLeftCorner).Y + iVar4) >> 1);
    }
    if (clip != (rect<int> *)0x0) {
      indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)offset;
      indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(iVar4 + offset.Y,offset.X + (int)local_98);
      core::rect<int>::clipAgainst((rect<int> *)&indices,clip);
      if ((int)indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish <
          (int)indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ <
          indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_) {
        return;
      }
    }
    uVar6 = 0;
    indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.is_sorted = true;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&indices.m_data,(ulong)(uint)(text->str)._M_string_length);
    offsets.m_data.
    super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    offsets.m_data.
    super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    offsets.m_data.
    super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    offsets.is_sorted = true;
    ::std::vector<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>::reserve
              (&offsets.m_data,(ulong)(uint)(text->str)._M_string_length);
    if ((int)(text->str)._M_string_length != 0) {
      do {
        uVar5 = (uint)uVar6;
        pwVar1 = (text->str)._M_dataplus._M_p;
        c = pwVar1[uVar6];
        if (c == L'\n') {
          bVar7 = true;
        }
        else if (c == L'\r') {
          bVar7 = pwVar1[uVar5 + 1] != L'\n';
          uVar3 = uVar5 + 1;
          if (bVar7) {
            uVar3 = uVar5;
          }
          c = (uint)bVar7 * 3 + L'\n';
          bVar7 = true;
          uVar5 = uVar3;
        }
        else {
          bVar7 = false;
        }
        if (bVar7) {
          offset.Y = offset.Y + this->MaxHeight;
          offset.X = (position->UpperLeftCorner).X;
          if (hcenter) {
            offset.X = ((position->LowerRightCorner).X - ((int)local_98 + offset.X) >> 1) + offset.X
            ;
          }
        }
        else {
          uVar3 = getAreaFromCharacter(this,c);
          pSVar2 = (this->Areas).m_data.
                   super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          offset.X = offset.X + pSVar2[uVar3].underhang;
          iVar4 = ::std::__cxx11::wstring::find((int)this + L'\x80',(ulong)(uint)c);
          if (iVar4 < 0) {
            if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&indices,
                         (iterator)
                         indices.m_data.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&pSVar2[uVar3].spriteno);
            }
            else {
              *indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = pSVar2[uVar3].spriteno;
              indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            indices.is_sorted = false;
            core::array<irr::core::vector2d<int>_>::push_back(&offsets,&offset);
          }
          offset.X = offset.X +
                     pSVar2[uVar3].overhang + pSVar2[uVar3].width + this->GlobalKerningWidth;
        }
        uVar6 = (ulong)(uVar5 + 1);
      } while (uVar5 + 1 < (uint)(text->str)._M_string_length);
    }
    (*this->SpriteBank->_vptr_IGUISpriteBank[10])
              (this->SpriteBank,&indices,&offsets,clip,&color_local,0,0,1,0);
    if (offsets.m_data.
        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(offsets.m_data.
                      super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)offsets.m_data.
                            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)offsets.m_data.
                            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(indices.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)indices.m_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)indices.m_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void CGUIFont::draw(const core::stringw &text, const core::rect<s32> &position,
		video::SColor color,
		bool hcenter, bool vcenter, const core::rect<s32> *clip)
{
	if (!Driver || !SpriteBank)
		return;

	core::dimension2d<s32> textDimension; // NOTE: don't make this u32 or the >> later on can fail when the dimension width is < position width
	core::position2d<s32> offset = position.UpperLeftCorner;

	if (hcenter || vcenter || clip)
		textDimension = getDimension(text.c_str());

	if (hcenter)
		offset.X += (position.getWidth() - textDimension.Width) >> 1;

	if (vcenter)
		offset.Y += (position.getHeight() - textDimension.Height) >> 1;

	if (clip) {
		core::rect<s32> clippedRect(offset, textDimension);
		clippedRect.clipAgainst(*clip);
		if (!clippedRect.isValid())
			return;
	}

	core::array<u32> indices(text.size());
	core::array<core::position2di> offsets(text.size());

	for (u32 i = 0; i < text.size(); i++) {
		wchar_t c = text[i];

		bool lineBreak = false;
		if (c == L'\r') { // Mac or Windows breaks
			lineBreak = true;
			if (text[i + 1] == L'\n') // Windows breaks
				c = text[++i];
		} else if (c == L'\n') { // Unix breaks
			lineBreak = true;
		}

		if (lineBreak) {
			offset.Y += MaxHeight;
			offset.X = position.UpperLeftCorner.X;

			if (hcenter) {
				offset.X += (position.getWidth() - textDimension.Width) >> 1;
			}
			continue;
		}

		SFontArea &area = Areas[getAreaFromCharacter(c)];

		offset.X += area.underhang;
		if (Invisible.findFirst(c) < 0) {
			indices.push_back(area.spriteno);
			offsets.push_back(offset);
		}

		offset.X += area.width + area.overhang + GlobalKerningWidth;
	}

	SpriteBank->draw2DSpriteBatch(indices, offsets, clip, color);
}